

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::TestChild::TestChild(TestChild *this,UnixEventPort *port,int exitCode)

{
  __pid_t _Var1;
  int osErrorNumber;
  Fault f;
  
  (this->pid).ptr.isSet = false;
  (this->promise).super_PromiseBase.node.disposer = (Disposer *)0x0;
  (this->promise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  do {
    _Var1 = fork();
    if (-1 < _Var1) {
      if (_Var1 == 0) {
        (anonymous_namespace)::exitCodeForSignal = exitCode;
        signal(0xf,exitSignalHandler);
        sigemptyset((sigset_t *)&f);
        sigaddset((sigset_t *)&f,0xf);
        sigprocmask(1,(sigset_t *)&f,(sigset_t *)0x0);
        do {
          pause();
        } while( true );
      }
      goto LAB_0021190d;
    }
    osErrorNumber = _::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x2be,osErrorNumber,"p = fork()","");
    _::Debug::Fault::fatal(&f);
  }
LAB_0021190d:
  (this->pid).ptr.field_1.value = _Var1;
  (this->pid).ptr.isSet = true;
  UnixEventPort::onChildExit((UnixEventPort *)&f,(Maybe<int> *)port);
  Own<kj::_::PromiseNode>::operator=
            ((Own<kj::_::PromiseNode> *)&this->promise,(Own<kj::_::PromiseNode> *)&f);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
  return;
}

Assistant:

TestChild(UnixEventPort& port, int exitCode) {
    pid_t p;
    KJ_SYSCALL(p = fork());
    if (p == 0) {
      // Arrange for SIGTERM to cause the process to exit normally.
      exitCodeForSignal = exitCode;
      signal(SIGTERM, &exitSignalHandler);
      sigset_t sigs;
      sigemptyset(&sigs);
      sigaddset(&sigs, SIGTERM);
      sigprocmask(SIG_UNBLOCK, &sigs, nullptr);

      for (;;) pause();
    }
    pid = p;
    promise = port.onChildExit(pid);
  }